

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  test_basic_learn();
  test_slot_learn();
  test_midi_learn();
  test_macro_learn();
  test_learn_many();
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    test_basic_learn();
    test_slot_learn();
    test_midi_learn();
    test_macro_learn();
    test_learn_many();
    return test_summary();
}